

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool array_array_container_inplace_union
                (array_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  int iVar1;
  array_container_t *paVar2;
  size_t sVar3;
  bitset_container_t *pbVar4;
  uint64_t uVar5;
  bitset_container_t *ourbitset;
  _Bool returnval;
  int totalCardinality;
  container_t **dst_local;
  array_container_t *src_2_local;
  array_container_t *src_1_local;
  
  iVar1 = src_1->cardinality + src_2->cardinality;
  *dst = (container_t *)0x0;
  if (iVar1 < 0x1001) {
    if (src_1->capacity < iVar1) {
      paVar2 = array_container_create_given_capacity(iVar1 * 2);
      *dst = paVar2;
      if (*dst == (container_t *)0x0) {
        src_1_local._7_1_ = true;
      }
      else {
        array_container_union(src_1,src_2,(array_container_t *)*dst);
        src_1_local._7_1_ = false;
      }
    }
    else {
      memmove(src_1->array + src_2->cardinality,src_1->array,(long)src_1->cardinality << 1);
      sVar3 = union_uint16(src_1->array + src_2->cardinality,(long)src_1->cardinality,src_2->array,
                           (long)src_2->cardinality,src_1->array);
      src_1->cardinality = (int32_t)sVar3;
      src_1_local._7_1_ = false;
    }
  }
  else {
    pbVar4 = bitset_container_create();
    *dst = pbVar4;
    src_1_local._7_1_ = true;
    if (*dst != (container_t *)0x0) {
      pbVar4 = (bitset_container_t *)*dst;
      bitset_set_list(pbVar4->words,src_1->array,(long)src_1->cardinality);
      uVar5 = bitset_set_list_withcard
                        (pbVar4->words,(long)src_1->cardinality,src_2->array,
                         (long)src_2->cardinality);
      pbVar4->cardinality = (int32_t)uVar5;
      if (pbVar4->cardinality < 0x1001) {
        if (src_1->capacity < pbVar4->cardinality) {
          array_container_grow(src_1,pbVar4->cardinality,false);
        }
        bitset_extract_setbits_uint16(pbVar4->words,0x400,src_1->array,0);
        src_1->cardinality = pbVar4->cardinality;
        *dst = src_1;
        bitset_container_free(pbVar4);
        src_1_local._7_1_ = false;
      }
    }
  }
  return src_1_local._7_1_;
}

Assistant:

bool array_array_container_inplace_union(
    array_container_t *src_1, const array_container_t *src_2,
    container_t **dst
){
    int totalCardinality = src_1->cardinality + src_2->cardinality;
    *dst = NULL;
    if (totalCardinality <= DEFAULT_MAX_SIZE) {
        if(src_1->capacity < totalCardinality) {
          *dst = array_container_create_given_capacity(2  * totalCardinality); // be purposefully generous
          if (*dst != NULL) {
              array_container_union(src_1, src_2, CAST_array(*dst));
          } else {
              return true; // otherwise failure won't be caught
          }
          return false;  // not a bitset
        } else {
          memmove(src_1->array + src_2->cardinality, src_1->array, src_1->cardinality * sizeof(uint16_t));
          src_1->cardinality = (int32_t)union_uint16(src_1->array + src_2->cardinality, src_1->cardinality,
                                  src_2->array, src_2->cardinality, src_1->array);
          return false; // not a bitset
        }
    }
    *dst = bitset_container_create();
    bool returnval = true;  // expect a bitset
    if (*dst != NULL) {
        bitset_container_t *ourbitset = CAST_bitset(*dst);
        bitset_set_list(ourbitset->words, src_1->array, src_1->cardinality);
        ourbitset->cardinality = (int32_t)bitset_set_list_withcard(
            ourbitset->words, src_1->cardinality, src_2->array,
            src_2->cardinality);
        if (ourbitset->cardinality <= DEFAULT_MAX_SIZE) {
            // need to convert!
            if(src_1->capacity < ourbitset->cardinality) {
              array_container_grow(src_1, ourbitset->cardinality, false);
            }

            bitset_extract_setbits_uint16(ourbitset->words, BITSET_CONTAINER_SIZE_IN_WORDS,
                                  src_1->array, 0);
            src_1->cardinality =  ourbitset->cardinality;
            *dst = src_1;
            bitset_container_free(ourbitset);
            returnval = false;  // not going to be a bitset
        }
    }
    return returnval;
}